

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O1

void __thiscall cppjieba::Trie::InsertNode(Trie *this,Unicode *key,DictUnit *ptValue)

{
  NextMap *pNVar1;
  __node_base_ptr p_Var2;
  TrieNode *pTVar3;
  _Hash_node_base *p_Var4;
  TrieNode *pTVar5;
  uint *__k;
  key_type local_40 [2];
  TrieNode *local_38;
  
  if (key->size_ != 0) {
    pTVar3 = this->root_;
    if (key->size_ != 0) {
      __k = key->ptr_;
      pTVar5 = pTVar3;
      do {
        if (pTVar5->next == (NextMap *)0x0) {
          pNVar1 = (NextMap *)operator_new(0x38);
          (pNVar1->_M_h)._M_buckets = &(pNVar1->_M_h)._M_single_bucket;
          (pNVar1->_M_h)._M_bucket_count = 1;
          (pNVar1->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          (pNVar1->_M_h)._M_element_count = 0;
          (pNVar1->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
          (pNVar1->_M_h)._M_rehash_policy._M_next_resize = 0;
          (pNVar1->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
          pTVar5->next = pNVar1;
        }
        p_Var2 = std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::_M_find_before_node
                           (&pTVar5->next->_M_h,(ulong)*__k % (pTVar5->next->_M_h)._M_bucket_count,
                            __k,(ulong)*__k);
        p_Var4 = (_Hash_node_base *)0x0;
        if (p_Var2 != (__node_base_ptr)0x0) {
          p_Var4 = p_Var2->_M_nxt;
        }
        if (p_Var4 == (_Hash_node_base *)0x0) {
          pTVar3 = (TrieNode *)operator_new(0x10);
          pTVar3->next = (NextMap *)0x0;
          pTVar3->ptValue = (DictUnit *)0x0;
          local_40[0] = *__k;
          local_38 = pTVar3;
          std::
          _Hashtable<unsigned_int,std::pair<unsigned_int_const,cppjieba::TrieNode*>,std::allocator<std::pair<unsigned_int_const,cppjieba::TrieNode*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<unsigned_int,cppjieba::TrieNode*>>
                    ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,cppjieba::TrieNode*>,std::allocator<std::pair<unsigned_int_const,cppjieba::TrieNode*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)pTVar5->next,local_40);
        }
        else {
          pTVar3 = (TrieNode *)p_Var4[2]._M_nxt;
        }
        __k = __k + 1;
        pTVar5 = pTVar3;
      } while (__k != key->ptr_ + key->size_);
    }
    if (pTVar3 == (TrieNode *)0x0) {
      __assert_fail("ptNode != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/Trie.hpp"
                    ,0x8d,"void cppjieba::Trie::InsertNode(const Unicode &, const DictUnit *)");
    }
    pTVar3->ptValue = ptValue;
  }
  return;
}

Assistant:

void InsertNode(const Unicode& key, const DictUnit* ptValue) {
    if (key.begin() == key.end()) {
      return;
    }

    TrieNode::NextMap::const_iterator kmIter;
    TrieNode *ptNode = root_;
    for (Unicode::const_iterator citer = key.begin(); citer != key.end(); ++citer) {
      if (NULL == ptNode->next) {
        ptNode->next = new TrieNode::NextMap;
      }
      kmIter = ptNode->next->find(*citer);
      if (ptNode->next->end() == kmIter) {
        TrieNode *nextNode = new TrieNode;

        ptNode->next->insert(make_pair(*citer, nextNode));
        ptNode = nextNode;
      } else {
        ptNode = kmIter->second;
      }
    }
    assert(ptNode != NULL);
    ptNode->ptValue = ptValue;
  }